

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::PopStyleVar(int count)

{
  long lVar1;
  int iVar2;
  ImGuiStyleMod *pIVar3;
  ImPlotContext *pIVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  pIVar4 = GImPlot;
  if ((GImPlot->StyleModifiers).Size < count) {
    __assert_fail("(count <= gp.StyleModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcdd,"void ImPlot::PopStyleVar(int)");
  }
  if (0 < count) {
    iVar7 = count + 1;
    do {
      lVar5 = (long)(pIVar4->StyleModifiers).Size;
      if (lVar5 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x695,"T &ImVector<ImGuiStyleMod>::back() [T = ImGuiStyleMod]");
      }
      pIVar3 = (pIVar4->StyleModifiers).Data;
      if (0x1a < (ulong)(uint)pIVar3[lVar5 + -1].VarIdx) {
        __assert_fail("idx >= 0 && idx < ImPlotStyleVar_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                      ,0x122,"const ImPlotStyleVarInfo *ImPlot::GetPlotStyleVarInfo(ImPlotStyleVar)"
                     );
      }
      lVar1 = (ulong)(uint)pIVar3[lVar5 + -1].VarIdx * 0xc;
      uVar6 = (ulong)*(uint *)(GPlotStyleVarInfo + lVar1 + 8);
      if (*(int *)(GPlotStyleVarInfo + lVar1) == 8) {
        if (*(int *)(GPlotStyleVarInfo + lVar1 + 4) == 1) {
          *(int *)(pIVar4->RenderY + uVar6 + 6) = pIVar3[lVar5 + -1].field_1.BackupInt[0];
        }
        else {
          if (*(int *)(GPlotStyleVarInfo + lVar1 + 4) != 2) goto LAB_001bbf70;
          *(int *)(pIVar4->RenderY + uVar6 + 6) = pIVar3[lVar5 + -1].field_1.BackupInt[0];
          *(int *)(pIVar4->RenderY + uVar6 + 10) = pIVar3[lVar5 + -1].field_1.BackupInt[1];
        }
      }
      else {
LAB_001bbf70:
        if ((*(int *)(GPlotStyleVarInfo + lVar1) == 4) &&
           (*(int *)(GPlotStyleVarInfo + lVar1 + 4) == 1)) {
          *(int *)(pIVar4->RenderY + uVar6 + 6) = pIVar3[lVar5 + -1].field_1.BackupInt[0];
        }
      }
      iVar2 = (pIVar4->StyleModifiers).Size;
      if (iVar2 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x6a1,"void ImVector<ImGuiStyleMod>::pop_back() [T = ImGuiStyleMod]");
      }
      (pIVar4->StyleModifiers).Size = iVar2 + -1;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  return;
}

Assistant:

void PopStyleVar(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.StyleModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0) {
        ImGuiStyleMod& backup = gp.StyleModifiers.back();
        const ImPlotStyleVarInfo* info = GetPlotStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&gp.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1) {
            ((float*)data)[0] = backup.BackupFloat[0];
        }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) {
             ((float*)data)[0] = backup.BackupFloat[0];
             ((float*)data)[1] = backup.BackupFloat[1];
        }
        else if (info->Type == ImGuiDataType_S32 && info->Count == 1) {
            ((int*)data)[0] = backup.BackupInt[0];
        }
        gp.StyleModifiers.pop_back();
        count--;
    }
}